

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O0

void __thiscall
rtosc::AutomationMgr::simpleSlope(AutomationMgr *this,int slot_id,int par,float slope,float offset)

{
  Automation *pAVar1;
  AutomationMapping *map;
  float offset_local;
  float slope_local;
  int par_local;
  int slot_id_local;
  AutomationMgr *this_local;
  
  if ((((slot_id < this->nslots) && (-1 < slot_id)) && (par < this->per_slot)) && (-1 < par)) {
    pAVar1 = this->slots[slot_id].automations;
    pAVar1[par].map.upoints = 2;
    *pAVar1[par].map.control_points = 0.0;
    pAVar1[par].map.control_points[1] = -(slope / 2.0) + offset;
    pAVar1[par].map.control_points[2] = 1.0;
    pAVar1[par].map.control_points[3] = slope / 2.0 + offset;
  }
  return;
}

Assistant:

void AutomationMgr::simpleSlope(int slot_id, int par, float slope, float offset)
{
    if(slot_id >= nslots || slot_id < 0 || par >= per_slot || par < 0)
        return;
    auto &map = slots[slot_id].automations[par].map;
    map.upoints = 2;
    map.control_points[0] = 0;
    map.control_points[1] = -(slope/2)+offset;
    map.control_points[2] =  1;
    map.control_points[3] =  slope/2+offset;

}